

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O0

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::CustomStaticConstraint<std::array<int,_3UL>,_std::array<double,_3UL>,_mp::ExponentialConeId>_>
::Container::Container
          (Container *this,int d,
          CustomStaticConstraint<std::array<int,_3UL>,_std::array<double,_3UL>,_mp::ExponentialConeId>
          *c)

{
  undefined4 in_ESI;
  CustomStaticConstraint<std::array<int,_3UL>,_std::array<double,_3UL>,_mp::ExponentialConeId>
  *in_RDI;
  CustomStaticConstraint<std::array<int,_3UL>,_std::array<double,_3UL>,_mp::ExponentialConeId>
  *in_stack_ffffffffffffff88;
  
  CustomStaticConstraint<std::array<int,_3UL>,_std::array<double,_3UL>,_mp::ExponentialConeId>::
  CustomStaticConstraint(in_RDI,in_stack_ffffffffffffff88);
  ExprWrapper<mp::CustomStaticConstraint<std::array<int,_3UL>,_std::array<double,_3UL>,_mp::ExponentialConeId>_>
  ::ExprWrapper((ExprWrapper<mp::CustomStaticConstraint<std::array<int,_3UL>,_std::array<double,_3UL>,_mp::ExponentialConeId>_>
                 *)in_RDI,in_stack_ffffffffffffff88);
  CustomStaticConstraint<std::array<int,_3UL>,_std::array<double,_3UL>,_mp::ExponentialConeId>::
  ~CustomStaticConstraint
            ((CustomStaticConstraint<std::array<int,_3UL>,_std::array<double,_3UL>,_mp::ExponentialConeId>
              *)0x43ea6b);
  *(undefined4 *)&in_RDI[1].super_BasicConstraint.name_ = in_ESI;
  Context::Context((Context *)&in_RDI[1].super_BasicConstraint.name_.field_0x4,CTX_NONE);
  *(undefined1 *)&in_RDI[1].super_BasicConstraint.name_._M_string_length = 0;
  *(undefined1 *)((long)&in_RDI[1].super_BasicConstraint.name_._M_string_length + 1) = 0;
  *(undefined1 *)((long)&in_RDI[1].super_BasicConstraint.name_._M_string_length + 2) = 0;
  return;
}

Assistant:

Container(int d, Constraint&& c) noexcept
      : con_(std::move(c)), depth_(d) { }